

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCollapse(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_48;
  int c;
  int fReorder;
  int fDualRail;
  int fBddSizeMax;
  int fVerbose;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fDualRail = 0;
  local_48 = 1;
  c = 0;
  fReorder = 1000000000;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Brdvh");
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsLogic(pAVar2);
        if ((iVar1 == 0) && (iVar1 = Abc_NtkIsStrash(pAVar2), iVar1 == 0)) {
          Abc_Print(-1,"Can only collapse a logic network or an AIG.\n");
          return 1;
        }
        iVar1 = Abc_NtkIsStrash(pAVar2);
        if (iVar1 == 0) {
          pAVar2 = Abc_NtkStrash(pAVar2,0,0,0);
          _fBddSizeMax = Abc_NtkCollapse(pAVar2,fReorder,c,local_48,fDualRail);
          Abc_NtkDelete(pAVar2);
        }
        else {
          _fBddSizeMax = Abc_NtkCollapse(pAVar2,fReorder,c,local_48,fDualRail);
        }
        if (_fBddSizeMax == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Collapsing has failed.\n");
          return 1;
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,_fBddSizeMax);
        return 0;
      }
      if (iVar1 == 0x42) break;
      if (iVar1 == 100) {
        c = c ^ 1;
      }
      else {
        if (iVar1 == 0x68) goto LAB_002291d8;
        if (iVar1 == 0x72) {
          local_48 = local_48 ^ 1;
        }
        else {
          if (iVar1 != 0x76) goto LAB_002291d8;
          fDualRail = fDualRail ^ 1;
        }
      }
    }
    if (argc <= globalUtilOptind) break;
    fReorder = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (fReorder < 0) {
LAB_002291d8:
      Abc_Print(-2,"usage: collapse [-B <num>] [-rdvh]\n");
      Abc_Print(-2,"\t          collapses the network by constructing global BDDs\n");
      Abc_Print(-2,"\t-B <num>: limit on live BDD nodes during collapsing [default = %d]\n",
                (ulong)(uint)fReorder);
      pcVar3 = "no";
      if (local_48 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-r      : toggles dynamic variable reordering [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (c != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d      : toggles dual-rail collapsing mode [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (fDualRail != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v      : print verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h      : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-B\" should be followed by an integer.\n");
  goto LAB_002291d8;
}

Assistant:

int Abc_CommandCollapse( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int fVerbose;
    int fBddSizeMax;
    int fDualRail;
    int fReorder;
    int c;
    pNtk = Abc_FrameReadNtk(pAbc);

    // set defaults
    fVerbose = 0;
    fReorder = 1;
    fDualRail = 0;
    fBddSizeMax = ABC_INFINITY;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Brdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            fBddSizeMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( fBddSizeMax < 0 )
                goto usage;
            break;
        case 'd':
            fDualRail ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'r':
            fReorder ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Can only collapse a logic network or an AIG.\n" );
        return 1;
    }

    // get the new network
    if ( Abc_NtkIsStrash(pNtk) )
        pNtkRes = Abc_NtkCollapse( pNtk, fBddSizeMax, fDualRail, fReorder, fVerbose );
    else
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkRes = Abc_NtkCollapse( pNtk, fBddSizeMax, fDualRail, fReorder, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Collapsing has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: collapse [-B <num>] [-rdvh]\n" );
    Abc_Print( -2, "\t          collapses the network by constructing global BDDs\n" );
    Abc_Print( -2, "\t-B <num>: limit on live BDD nodes during collapsing [default = %d]\n", fBddSizeMax );
    Abc_Print( -2, "\t-r      : toggles dynamic variable reordering [default = %s]\n", fReorder? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggles dual-rail collapsing mode [default = %s]\n", fDualRail? "yes": "no" );
    Abc_Print( -2, "\t-v      : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}